

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_set_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL target_complexity)

{
  int iVar1;
  REF_NODE pRVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  REF_DBL current_complexity;
  double local_58;
  double local_50;
  double local_48;
  
  pRVar2 = ref_grid->node;
  iVar1 = ref_grid->twod;
  local_48 = target_complexity;
  uVar3 = ref_metric_complexity(metric,ref_grid,&local_58);
  if (uVar3 == 0) {
    dVar7 = local_58 * 1e+20;
    if (dVar7 <= -dVar7) {
      dVar7 = -dVar7;
    }
    dVar8 = local_48;
    if (local_48 <= -local_48) {
      dVar8 = -local_48;
    }
    uVar3 = 4;
    if (dVar8 < dVar7) {
      if (0 < pRVar2->max) {
        dVar7 = *(double *)(&DAT_0023b0d0 + (ulong)(iVar1 == 0) * 8);
        lVar6 = 0;
        pRVar4 = metric;
        dVar8 = local_48;
        local_50 = dVar7;
        do {
          if (-1 < pRVar2->global[lVar6]) {
            lVar5 = 0;
            do {
              dVar7 = pow(dVar8 / local_58,dVar7);
              pRVar4[lVar5] = dVar7 * pRVar4[lVar5];
              lVar5 = lVar5 + 1;
              dVar7 = local_50;
              dVar8 = local_48;
            } while (lVar5 != 6);
            if (ref_grid->twod != 0) {
              metric[lVar6 * 6 + 2] = 0.0;
              metric[lVar6 * 6 + 4] = 0.0;
              metric[lVar6 * 6 + 5] = 1.0;
            }
          }
          lVar6 = lVar6 + 1;
          pRVar4 = pRVar4 + 6;
        } while (lVar6 < pRVar2->max);
      }
      uVar3 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x7c8,
           "ref_metric_set_complexity",(ulong)uVar3,"cmp");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_set_complexity(REF_DBL *metric, REF_GRID ref_grid,
                                             REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(target_complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(target_complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  return REF_SUCCESS;
}